

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O3

void Curl_debug(Curl_easy *data,curl_infotype type,char *ptr,size_t size)

{
  curl_trc_feat *pcVar1;
  _Bool value;
  int iVar2;
  size_t sVar3;
  size_t maxlen;
  char *pcVar4;
  void *pvVar5;
  char acStack_838 [2056];
  
  if (((data->set).field_0x89f & 0x40) == 0) {
    return;
  }
  pcVar4 = acStack_838;
  if ((data->set).fdebug == (curl_debug_callback)0x0) {
    if (CURLINFO_HEADER_OUT < type) {
      return;
    }
    pcVar1 = (data->state).feat;
    if (((pcVar1 == (curl_trc_feat *)0x0) || (0 < pcVar1->log_level)) &&
       (0 < Curl_trc_feat_ids.log_level)) {
      sVar3 = trc_print_ids(data,acStack_838,(size_t)ptr);
      fwrite(acStack_838,sVar3,1,(FILE *)(data->set).err);
    }
    fwrite(Curl_debug::s_infotype + type,2,1,(FILE *)(data->set).err);
    fwrite(ptr,size,1,(FILE *)(data->set).err);
    return;
  }
  value = Curl_is_in_callback(data);
  if (((data->set).field_0x89f & 0x40) != 0) {
    pcVar1 = (data->state).feat;
    if (pcVar1 == (curl_trc_feat *)0x0) {
      if (size < 0x800) {
LAB_001222a8:
        if (0 < Curl_trc_feat_ids.log_level) {
          sVar3 = trc_print_ids(data,acStack_838,maxlen);
          iVar2 = curl_msnprintf(acStack_838 + sVar3,0x800 - sVar3,"%.*s",size & 0xffffffff,ptr);
          size = (long)iVar2 + sVar3;
          if (0x7fe < size) {
            builtin_strncpy(acStack_838 + 0x7fb,"...\n",4);
            size = 0x7ff;
          }
          acStack_838[size] = '\0';
          Curl_set_in_callback(data,true);
          pvVar5 = (data->set).debugdata;
          goto LAB_00122324;
        }
      }
    }
    else if ((size < 0x800) && (0 < pcVar1->log_level)) goto LAB_001222a8;
  }
  Curl_set_in_callback(data,true);
  pvVar5 = (data->set).debugdata;
  pcVar4 = ptr;
LAB_00122324:
  (*(data->set).fdebug)(data,type,pcVar4,size,pvVar5);
  Curl_set_in_callback(data,value);
  return;
}

Assistant:

void Curl_debug(struct Curl_easy *data, curl_infotype type,
                const char *ptr, size_t size)
{
  if(data->set.verbose) {
    static const char s_infotype[CURLINFO_END][3] = {
      "* ", "< ", "> ", "{ ", "} ", "{ ", "} " };
    char buf[TRC_LINE_MAX];
    size_t len;
    if(data->set.fdebug) {
      bool inCallback = Curl_is_in_callback(data);

      if(CURL_TRC_IDS(data) && (size < TRC_LINE_MAX)) {
        len = trc_print_ids(data, buf, TRC_LINE_MAX);
        len += msnprintf(buf + len, TRC_LINE_MAX - len, "%.*s",
                         (int)size, ptr);
        len = trc_end_buf(buf, len, TRC_LINE_MAX, FALSE);
        Curl_set_in_callback(data, TRUE);
        (void)(*data->set.fdebug)(data, type, buf, len, data->set.debugdata);
        Curl_set_in_callback(data, inCallback);
      }
      else {
        Curl_set_in_callback(data, TRUE);
        (void)(*data->set.fdebug)(data, type, CURL_UNCONST(ptr),
                                  size, data->set.debugdata);
        Curl_set_in_callback(data, inCallback);
      }
    }
    else {
      switch(type) {
      case CURLINFO_TEXT:
      case CURLINFO_HEADER_OUT:
      case CURLINFO_HEADER_IN:
        if(CURL_TRC_IDS(data)) {
          len = trc_print_ids(data, buf, TRC_LINE_MAX);
          fwrite(buf, len, 1, data->set.err);
        }
        fwrite(s_infotype[type], 2, 1, data->set.err);
        fwrite(ptr, size, 1, data->set.err);
        break;
      default: /* nada */
        break;
      }
    }
  }
}